

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::SystemIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SystemIdentifier *this)

{
  undefined2 uVar1;
  ostream *poVar2;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_208;
  KString local_1e8;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"System Identifier:",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n\tType:           ",0x12);
  ENUMS::GetEnumAsStringSystemType_abi_cxx11_
            (&local_1c8,(ENUMS *)(ulong)this->m_ui16SystemType,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tName:           ",0x12);
  ENUMS::GetEnumAsStringSystemName_abi_cxx11_
            (&local_1e8,(ENUMS *)(ulong)this->m_ui16SystemName,Value_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tMode:           ",0x12);
  ENUMS::GetEnumAsStringSystemMode_abi_cxx11_
            (&local_208,(ENUMS *)(ulong)this->m_ui8SystemMode,Value_01);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tChange/Options: ",0x12);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  uVar1 = this->m_ui16SystemType;
  if ((ushort)(uVar1 - 1) < 2) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"\tAlt Mode 4: ",0xd);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tAlt Mode C:  ",0xf);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

KString SystemIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "System Identifier:"
       << "\n\tType:           " << GetEnumAsStringSystemType( m_ui16SystemType )
       << "\n\tName:           " << GetEnumAsStringSystemName( m_ui16SystemName )
       << "\n\tMode:           " << GetEnumAsStringSystemMode( m_ui8SystemMode )
       << "\n\tChange/Options: " << ( KBOOL )m_ui8ChangeIndicator
       << "\n";

    if( m_ui16SystemType == Mark_X_XII_ATCRBS_ModeS_Interrogator ||
            m_ui16SystemType == Mark_X_XII_ATCRBS_ModeS_Transponder )
    {
        ss << "\tAlt Mode 4: " << ( KUINT16 )m_ui8AltMode4
           << "\n\tAlt Mode C:  " << ( KUINT16 )m_ui8AltModeC
           << "\n";
    }

    return ss.str();
}